

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void luaI_openlib(lua_State *L,char *libname,luaL_Reg *l,int nup)

{
  int szhint;
  int iVar1;
  char *pcVar2;
  int local_2c;
  int i;
  int size;
  int nup_local;
  luaL_Reg *l_local;
  char *libname_local;
  lua_State *L_local;
  
  _size = l;
  if (libname != (char *)0x0) {
    szhint = libsize(l);
    luaL_findtable(L,-10000,"_LOADED",1);
    lua_getfield(L,-1,libname);
    iVar1 = lua_type(L,-1);
    if (iVar1 != 5) {
      lua_settop(L,-2);
      pcVar2 = luaL_findtable(L,-0x2712,libname,szhint);
      if (pcVar2 != (char *)0x0) {
        luaL_error(L,"name conflict for module \'%s\'",libname);
      }
      lua_pushvalue(L,-1);
      lua_setfield(L,-3,libname);
    }
    lua_remove(L,-2);
    lua_insert(L,-(nup + 1));
  }
  for (; _size->name != (char *)0x0; _size = _size + 1) {
    for (local_2c = 0; local_2c < nup; local_2c = local_2c + 1) {
      lua_pushvalue(L,-nup);
    }
    lua_pushcclosure(L,_size->func,nup);
    lua_setfield(L,-(nup + 2),_size->name);
  }
  lua_settop(L,-1 - nup);
  return;
}

Assistant:

static void luaI_openlib(lua_State*L,const char*libname,
const luaL_Reg*l,int nup){
if(libname){
int size=libsize(l);
luaL_findtable(L,(-10000),"_LOADED",1);
lua_getfield(L,-1,libname);
if(!lua_istable(L,-1)){
lua_pop(L,1);
if(luaL_findtable(L,(-10002),libname,size)!=NULL)
luaL_error(L,"name conflict for module "LUA_QL("%s"),libname);
lua_pushvalue(L,-1);
lua_setfield(L,-3,libname);
}
lua_remove(L,-2);
lua_insert(L,-(nup+1));
}
for(;l->name;l++){
int i;
for(i=0;i<nup;i++)
lua_pushvalue(L,-nup);
lua_pushcclosure(L,l->func,nup);
lua_setfield(L,-(nup+2),l->name);
}
lua_pop(L,nup);
}